

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

connectdata * allocate_conn(Curl_easy *data)

{
  size_t sVar1;
  ssl_backend_data *psVar2;
  char *pcVar3;
  bool bVar4;
  curltime cVar5;
  undefined4 uStack_44;
  undefined4 uStack_34;
  char *ssl;
  size_t sslsize;
  connectdata *conn;
  Curl_easy *data_local;
  
  data_local = (Curl_easy *)(*Curl_ccalloc)(1,0x630);
  if (data_local == (Curl_easy *)0x0) {
    data_local = (Curl_easy *)0x0;
  }
  else {
    sVar1 = Curl_ssl->sizeof_ssl_backend_data;
    psVar2 = (ssl_backend_data *)(*Curl_ccalloc)(4,sVar1);
    if (psVar2 == (ssl_backend_data *)0x0) {
      (*Curl_cfree)(data_local);
      data_local = (Curl_easy *)0x0;
    }
    else {
      *(ssl_backend_data **)((data_local->req).doh.probe[0].dohbuffer + 0xfc) = psVar2;
      *(ssl_backend_data **)((data_local->req).doh.probe[0].dohbuffer + 0xa4) = psVar2;
      *(ssl_backend_data **)((data_local->req).doh.probe[0].dohbuffer + 0xbc) =
           (ssl_backend_data *)((psVar2->tap_state).master_key + (sVar1 - 0x1c));
      *(ssl_backend_data **)((data_local->req).doh.probe[0].dohbuffer + 0xd4) =
           (ssl_backend_data *)((psVar2->tap_state).master_key + sVar1 * 2 + -0x1c);
      *(ssl_backend_data **)((data_local->req).doh.probe[0].dohbuffer + 0xec) =
           (ssl_backend_data *)((psVar2->tap_state).master_key + sVar1 * 3 + -0x1c);
      *(Curl_handler **)((data_local->req).doh.probe[0].dohbuffer + 0x1cc) = &Curl_handler_dummy;
      *(curl_socket_t *)((data_local->req).doh.probe[0].dohbuffer + 100) = -1;
      *(curl_socket_t *)((data_local->req).doh.probe[0].dohbuffer + 0x68) = -1;
      *(curl_socket_t *)((data_local->req).doh.probe[0].dohbuffer + 0x6c) = -1;
      *(curl_socket_t *)((data_local->req).doh.probe[0].dohbuffer + 0x70) = -1;
      data_local->mstate = ~CURLM_STATE_INIT;
      data_local->result = ~CURLE_OK;
      *(undefined8 *)&(data_local->req).start100.tv_usec = 0xffffffffffffffff;
      (data_local->req).exp100 = ~EXP100_SEND_DATA;
      Curl_conncontrol((connectdata *)data_local,1);
      cVar5 = Curl_now();
      ((curltime *)((data_local->req).doh.probe[0].dohbuffer + 0x44))->tv_sec = cVar5.tv_sec;
      *(ulong *)((data_local->req).doh.probe[0].dohbuffer + 0x4c) =
           CONCAT44(uStack_34,cVar5.tv_usec);
      cVar5 = Curl_now();
      ((curltime *)((data_local->req).doh.probe[0].dohbuffer + 0x1e4))->tv_sec = cVar5.tv_sec;
      *(ulong *)((data_local->req).doh.probe[0].dohbuffer + 0x1ec) =
           CONCAT44(uStack_44,cVar5.tv_usec);
      *(long *)((data_local->req).doh.probe[0].dohbuffer + 500) = (data->set).upkeep_interval_ms;
      data_local->next = data;
      *(curl_proxytype *)&(data_local->req).offset = (data->set).proxytype;
      (data_local->req).now.tv_usec = CURLPROXY_SOCKS4;
      bVar4 = false;
      if ((data->set).str[0x15] != (char *)0x0) {
        bVar4 = *(data->set).str[0x15] != '\0';
      }
      *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) =
           *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) & 0xffffffef |
           (uint)bVar4 << 4;
      bVar4 = false;
      if ((((*(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) >> 4 & 1) != 0) &&
          (bVar4 = true, *(curl_proxytype *)&(data_local->req).offset != CURLPROXY_HTTP)) &&
         (bVar4 = true, *(curl_proxytype *)&(data_local->req).offset != CURLPROXY_HTTP_1_0)) {
        bVar4 = *(curl_proxytype *)&(data_local->req).offset == CURLPROXY_HTTPS;
      }
      *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) =
           *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) & 0xffffffdf |
           (uint)bVar4 << 5;
      bVar4 = false;
      if ((*(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) >> 4 & 1) != 0) {
        bVar4 = (*(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) >> 5 & 1) == 0;
      }
      *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) =
           *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) & 0xffffffbf |
           (uint)bVar4 << 6;
      if (((data->set).str[0x16] != (char *)0x0) && (*(data->set).str[0x16] != '\0')) {
        *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) =
             *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) & 0xffffffef | 0x10;
        *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) =
             *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) & 0xffffffbf | 0x40;
      }
      *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) =
           *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) & 0xfffffeff |
           (uint)((data->set).str[0x2f] != (char *)0x0) << 8;
      *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) =
           *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) & 0xffffbfff |
           ((uint)(*(ulong *)&(data->set).field_0x878 >> 10) & 1) << 0xe;
      *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) =
           *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) & 0xffffff7f |
           (uint)((data->set).str[0x2c] != (char *)0x0) << 7;
      *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) =
           *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) & 0xfffdffff |
           ((uint)(*(ulong *)&(data->set).field_0x878 >> 0xf) & 1) << 0x11;
      *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) =
           *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) & 0xfffbffff |
           ((uint)((ulong)*(undefined8 *)&(data->set).field_0x878 >> 0x10) & 1) << 0x12;
      (data_local->req).doh.probe[0].dohbuffer[0x14c] =
           (data_local->req).doh.probe[0].dohbuffer[0x14c] & 0xfb |
           ((byte)(data->set).ssl.primary.field_0x48 >> 2 & 1) << 2;
      (data_local->req).doh.probe[0].dohbuffer[0x14c] =
           (data_local->req).doh.probe[0].dohbuffer[0x14c] & 0xfe |
           (data->set).ssl.primary.field_0x48 & 1;
      (data_local->req).doh.probe[0].dohbuffer[0x14c] =
           (data_local->req).doh.probe[0].dohbuffer[0x14c] & 0xfd |
           ((byte)(data->set).ssl.primary.field_0x48 >> 1 & 1) << 1;
      (data_local->req).doh.probe[0].dohbuffer[0x19c] =
           (data_local->req).doh.probe[0].dohbuffer[0x19c] & 0xfb |
           ((byte)(data->set).proxy_ssl.primary.field_0x48 >> 2 & 1) << 2;
      (data_local->req).doh.probe[0].dohbuffer[0x19c] =
           (data_local->req).doh.probe[0].dohbuffer[0x19c] & 0xfe |
           (data->set).proxy_ssl.primary.field_0x48 & 1;
      (data_local->req).doh.probe[0].dohbuffer[0x19c] =
           (data_local->req).doh.probe[0].dohbuffer[0x19c] & 0xfd |
           ((byte)(data->set).proxy_ssl.primary.field_0x48 >> 1 & 1) << 1;
      *(long *)((data_local->req).doh.probe[0].dohbuffer + 0x1dc) = (data->set).ipver;
      *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) =
           *(uint *)((data_local->req).doh.probe[0].dohbuffer + 0x1a8) & 0x7fffffff |
           (uint)((ulong)*(undefined8 *)&(data->set).field_0x878 >> 0x25) << 0x1f;
      Curl_llist_init((curl_llist *)((data_local->req).doh.probe[1].dohbuffer + 0x2c),llist_dtor);
      if ((data->set).str[8] != (char *)0x0) {
        pcVar3 = (*Curl_cstrdup)((data->set).str[8]);
        *(char **)((data_local->req).doh.probe[1].dohbuffer + 0x1dc) = pcVar3;
        if (*(long *)((data_local->req).doh.probe[1].dohbuffer + 0x1dc) == 0) {
          Curl_llist_destroy((curl_llist *)((data_local->req).doh.probe[1].dohbuffer + 0x2c),
                             (void *)0x0);
          (*Curl_cfree)(*(void **)((data_local->req).doh.probe[1].dohbuffer + 0x1dc));
          (*Curl_cfree)(*(void **)((data_local->req).doh.probe[0].dohbuffer + 0xfc));
          (*Curl_cfree)(data_local);
          return (connectdata *)(Curl_easy *)0x0;
        }
      }
      *(int *)((data_local->req).doh.probe[1].dohbuffer + 0x1e8) = (data->set).localportrange;
      *(unsigned_short *)((data_local->req).doh.probe[1].dohbuffer + 0x1e4) = (data->set).localport;
      (data_local->conn_queue).prev = (curl_llist_element *)(data->set).fclosesocket;
      (data_local->conn_queue).next = (curl_llist_element *)(data->set).closesocket_client;
    }
  }
  return (connectdata *)data_local;
}

Assistant:

static struct connectdata *allocate_conn(struct Curl_easy *data)
{
  struct connectdata *conn = calloc(1, sizeof(struct connectdata));
  if(!conn)
    return NULL;

#ifdef USE_SSL
  /* The SSL backend-specific data (ssl_backend_data) objects are allocated as
     a separate array to ensure suitable alignment.
     Note that these backend pointers can be swapped by vtls (eg ssl backend
     data becomes proxy backend data). */
  {
    size_t sslsize = Curl_ssl->sizeof_ssl_backend_data;
    char *ssl = calloc(4, sslsize);
    if(!ssl) {
      free(conn);
      return NULL;
    }
    conn->ssl_extra = ssl;
    conn->ssl[0].backend = (void *)ssl;
    conn->ssl[1].backend = (void *)(ssl + sslsize);
    conn->proxy_ssl[0].backend = (void *)(ssl + 2 * sslsize);
    conn->proxy_ssl[1].backend = (void *)(ssl + 3 * sslsize);
  }
#endif

  conn->handler = &Curl_handler_dummy;  /* Be sure we have a handler defined
                                           already from start to avoid NULL
                                           situations and checks */

  /* and we setup a few fields in case we end up actually using this struct */

  conn->sock[FIRSTSOCKET] = CURL_SOCKET_BAD;     /* no file descriptor */
  conn->sock[SECONDARYSOCKET] = CURL_SOCKET_BAD; /* no file descriptor */
  conn->tempsock[0] = CURL_SOCKET_BAD; /* no file descriptor */
  conn->tempsock[1] = CURL_SOCKET_BAD; /* no file descriptor */
  conn->connection_id = -1;    /* no ID */
  conn->port = -1; /* unknown at this point */
  conn->remote_port = -1; /* unknown at this point */
#if defined(USE_RECV_BEFORE_SEND_WORKAROUND) && defined(DEBUGBUILD)
  conn->postponed[0].bindsock = CURL_SOCKET_BAD; /* no file descriptor */
  conn->postponed[1].bindsock = CURL_SOCKET_BAD; /* no file descriptor */
#endif /* USE_RECV_BEFORE_SEND_WORKAROUND && DEBUGBUILD */

  /* Default protocol-independent behavior doesn't support persistent
     connections, so we set this to force-close. Protocols that support
     this need to set this to FALSE in their "curl_do" functions. */
  connclose(conn, "Default to force-close");

  /* Store creation time to help future close decision making */
  conn->created = Curl_now();

  /* Store current time to give a baseline to keepalive connection times. */
  conn->keepalive = Curl_now();

  /* Store off the configured connection upkeep time. */
  conn->upkeep_interval_ms = data->set.upkeep_interval_ms;

  conn->data = data; /* Setup the association between this connection
                        and the Curl_easy */

  conn->http_proxy.proxytype = data->set.proxytype;
  conn->socks_proxy.proxytype = CURLPROXY_SOCKS4;

#if !defined(CURL_DISABLE_PROXY)
  /* note that these two proxy bits are now just on what looks to be
     requested, they may be altered down the road */
  conn->bits.proxy = (data->set.str[STRING_PROXY] &&
                      *data->set.str[STRING_PROXY]) ? TRUE : FALSE;
  conn->bits.httpproxy = (conn->bits.proxy &&
                          (conn->http_proxy.proxytype == CURLPROXY_HTTP ||
                           conn->http_proxy.proxytype == CURLPROXY_HTTP_1_0 ||
                           conn->http_proxy.proxytype == CURLPROXY_HTTPS)) ?
                           TRUE : FALSE;
  conn->bits.socksproxy = (conn->bits.proxy &&
                           !conn->bits.httpproxy) ? TRUE : FALSE;

  if(data->set.str[STRING_PRE_PROXY] && *data->set.str[STRING_PRE_PROXY]) {
    conn->bits.proxy = TRUE;
    conn->bits.socksproxy = TRUE;
  }

  conn->bits.proxy_user_passwd =
    (data->set.str[STRING_PROXYUSERNAME]) ? TRUE : FALSE;
  conn->bits.tunnel_proxy = data->set.tunnel_thru_httpproxy;
#endif /* CURL_DISABLE_PROXY */

  conn->bits.user_passwd = (data->set.str[STRING_USERNAME]) ? TRUE : FALSE;
#ifndef CURL_DISABLE_FTP
  conn->bits.ftp_use_epsv = data->set.ftp_use_epsv;
  conn->bits.ftp_use_eprt = data->set.ftp_use_eprt;
#endif
  conn->ssl_config.verifystatus = data->set.ssl.primary.verifystatus;
  conn->ssl_config.verifypeer = data->set.ssl.primary.verifypeer;
  conn->ssl_config.verifyhost = data->set.ssl.primary.verifyhost;
  conn->proxy_ssl_config.verifystatus =
    data->set.proxy_ssl.primary.verifystatus;
  conn->proxy_ssl_config.verifypeer = data->set.proxy_ssl.primary.verifypeer;
  conn->proxy_ssl_config.verifyhost = data->set.proxy_ssl.primary.verifyhost;
  conn->ip_version = data->set.ipver;
  conn->bits.connect_only = data->set.connect_only;

#if !defined(CURL_DISABLE_HTTP) && defined(USE_NTLM) && \
    defined(NTLM_WB_ENABLED)
  conn->ntlm_auth_hlpr_socket = CURL_SOCKET_BAD;
#endif

  /* Initialize the easy handle list */
  Curl_llist_init(&conn->easyq, (curl_llist_dtor) llist_dtor);

#ifdef HAVE_GSSAPI
  conn->data_prot = PROT_CLEAR;
#endif

  /* Store the local bind parameters that will be used for this connection */
  if(data->set.str[STRING_DEVICE]) {
    conn->localdev = strdup(data->set.str[STRING_DEVICE]);
    if(!conn->localdev)
      goto error;
  }
  conn->localportrange = data->set.localportrange;
  conn->localport = data->set.localport;

  /* the close socket stuff needs to be copied to the connection struct as
     it may live on without (this specific) Curl_easy */
  conn->fclosesocket = data->set.fclosesocket;
  conn->closesocket_client = data->set.closesocket_client;

  return conn;
  error:

  Curl_llist_destroy(&conn->easyq, NULL);
  free(conn->localdev);
#ifdef USE_SSL
  free(conn->ssl_extra);
#endif
  free(conn);
  return NULL;
}